

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

void __thiscall CoreML::Model::Model(Model *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  Model *pMVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined1 local_29;
  Model *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  this->_vptr_Model = (_func_int **)&PTR__Model_00708c68;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_28 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CoreML::Specification::Model,std::allocator<CoreML::Specification::Model>>
            (a_Stack_20,&local_28,(allocator<CoreML::Specification::Model> *)&local_29);
  _Var2._M_pi = a_Stack_20[0]._M_pi;
  pMVar1 = local_28;
  local_28 = (Model *)0x0;
  a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->m_spec).
            super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = pMVar1;
  (this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  ((this->m_spec).super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr)->specificationversion_ = 5;
  return;
}

Assistant:

Model::Model() {
        m_spec = std::make_shared<Specification::Model>();
        m_spec->set_specificationversion(MLMODEL_SPECIFICATION_VERSION);
    }